

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O2

bool __thiscall
PDFUsedFont::EnumeratePaths
          (PDFUsedFont *this,IOutlineEnumerator *target,string *inText,double inFontSize)

{
  bool bVar1;
  UIntList glyphs;
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  local_28._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_28;
  local_28._M_impl._M_node._M_size = 0;
  local_28._M_impl._M_node.super__List_node_base._M_prev =
       local_28._M_impl._M_node.super__List_node_base._M_next;
  GetUnicodeGlyphs(this,inText,(UIntList *)local_28._M_impl._M_node.super__List_node_base._M_next);
  bVar1 = EnumeratePaths(this,target,(UIntList *)&local_28,inFontSize);
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_28);
  return bVar1;
}

Assistant:

bool PDFUsedFont::EnumeratePaths(IOutlineEnumerator& target, const std::string& inText,double inFontSize)
{
	UIntList glyphs;
	GetUnicodeGlyphs(inText, glyphs);
	return EnumeratePaths(target, glyphs,inFontSize);
}